

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_table_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  __m256i *__return_storage_ptr__;
  int *piVar1;
  __m256i *palVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint i;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i vWH;
  __m256i vWH_00;
  __m256i vWH_01;
  __m256i vWH_02;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint uVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  int64_t iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  char *pcVar23;
  int iVar24;
  ulong uVar25;
  int64_t iVar26;
  long lVar27;
  long lVar28;
  long lVar30;
  char *__format;
  int iVar31;
  __m256i *palVar32;
  int iVar33;
  long lVar34;
  int32_t j;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar39 [16];
  undefined8 uVar37;
  undefined1 auVar38 [16];
  undefined8 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined8 uVar45;
  undefined8 uVar49;
  undefined1 auVar44 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar63 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  __m256i_64_t B;
  undefined1 in_stack_fffffffffffff8e0 [16];
  undefined1 local_680 [32];
  long local_660;
  long lStack_658;
  long lStack_648;
  long local_620;
  long lStack_618;
  long lStack_608;
  undefined1 local_5a0 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  long local_300;
  long lStack_2f8;
  long lStack_2f0;
  long lStack_2e8;
  undefined1 local_2e0 [32];
  ulong local_2c0;
  ulong uStack_2b8;
  ulong uStack_2b0;
  ulong uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  long local_200;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  undefined1 local_1e0 [32];
  ulong local_1c0;
  ulong uStack_1b8;
  ulong uStack_1b0;
  ulong uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  int64_t iVar22;
  ulong uVar29;
  long lVar48;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "_s2";
LAB_00780dae:
    fprintf(_stderr,__format,"parasail_sw_stats_table_diag_avx2_256_64",pcVar23);
    return (parasail_result_t *)0x0;
  }
  uVar36 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar23 = "s2Len";
    goto LAB_00780dae;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar23 = "open";
    goto LAB_00780dae;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar23 = "gap";
    goto LAB_00780dae;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "matrix";
    goto LAB_00780dae;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_sw_stats_table_diag_avx2_256_64");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar23 = "_s1";
      goto LAB_00780dae;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar23 = "_s1Len";
      goto LAB_00780dae;
    }
    if (matrix->type == 0) goto LAB_0077fc00;
  }
  _s1Len = matrix->length;
LAB_0077fc00:
  iVar31 = matrix->min;
  uVar25 = (ulong)(uint)open;
  uVar29 = 0x8000000000000000 - (long)iVar31;
  if (iVar31 != -open && SBORROW4(iVar31,-open) == iVar31 + open < 0) {
    uVar29 = uVar25 | 0x8000000000000000;
  }
  lVar28 = uVar29 + 1;
  iVar31 = matrix->max;
  local_220._8_8_ = lVar28;
  local_220._0_8_ = lVar28;
  local_220._16_8_ = lVar28;
  local_220._24_8_ = lVar28;
  local_3c0._8_8_ = lVar28;
  local_3c0._0_8_ = lVar28;
  local_3c0._16_8_ = lVar28;
  local_3c0._24_8_ = lVar28;
  local_3e0._8_8_ = lVar28;
  local_3e0._0_8_ = lVar28;
  local_3e0._16_8_ = lVar28;
  local_3e0._24_8_ = lVar28;
  local_400._8_8_ = lVar28;
  local_400._0_8_ = lVar28;
  local_400._16_8_ = lVar28;
  local_400._24_8_ = lVar28;
  local_420._8_8_ = lVar28;
  local_420._0_8_ = lVar28;
  local_420._16_8_ = lVar28;
  local_420._24_8_ = lVar28;
  local_320._8_8_ = lVar28;
  local_320._0_8_ = lVar28;
  local_320._16_8_ = lVar28;
  local_320._24_8_ = lVar28;
  ppVar15 = parasail_result_new_table3(_s1Len,s2Len);
  if (ppVar15 != (parasail_result_t *)0x0) {
    ppVar15->flag = ppVar15->flag | 0x4831004;
    ptr = parasail_memalign_int64_t(0x20,(long)(int)(_s1Len + 3));
    uVar29 = (ulong)(s2Len + 6);
    ptr_00 = parasail_memalign_int64_t(0x20,uVar29);
    ptr_01 = parasail_memalign_int64_t(0x20,uVar29);
    ptr_02 = parasail_memalign_int64_t(0x20,uVar29);
    ptr_03 = parasail_memalign_int64_t(0x20,uVar29);
    ptr_04 = parasail_memalign_int64_t(0x20,uVar29);
    ptr_05 = parasail_memalign_int64_t(0x20,uVar29);
    ptr_06 = parasail_memalign_int64_t(0x20,uVar29);
    ptr_07 = parasail_memalign_int64_t(0x20,uVar29);
    ptr_08 = parasail_memalign_int64_t(0x20,uVar29);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = ptr_03;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = ptr_04;
    auVar51 = vpunpcklqdq_avx(auVar51,auVar63);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = ptr_05;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = ptr_06;
    auVar63 = vpunpcklqdq_avx(auVar38,auVar47);
    auVar38 = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar51;
    auVar47 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar63;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = ptr;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = ptr_00;
    auVar51 = vpunpcklqdq_avx(auVar50,auVar64);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = ptr_01;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = ptr_02;
    auVar63 = vpunpcklqdq_avx(auVar65,auVar73);
    auVar51 = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar51;
    auVar63 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar63;
    auVar54._0_8_ = -(ulong)(auVar51._0_8_ == 0);
    auVar54._8_8_ = -(ulong)(auVar51._8_8_ == 0);
    auVar54._16_8_ = -(ulong)(auVar63._0_8_ == 0);
    auVar54._24_8_ = -(ulong)(auVar63._8_8_ == 0);
    auVar40._0_8_ = -(ulong)(auVar38._0_8_ == 0);
    auVar40._8_8_ = -(ulong)(auVar38._8_8_ == 0);
    auVar40._16_8_ = -(ulong)(auVar47._0_8_ == 0);
    auVar40._24_8_ = -(ulong)(auVar47._8_8_ == 0);
    auVar40 = vpackssdw_avx2(auVar54,auVar40);
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
              (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            SUB321(auVar40 >> 0x7f,0) == '\0') &&
           (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          SUB321(auVar40 >> 0xbf,0) == '\0') &&
         (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar40[0x1f]))
    {
      uVar13 = s2Len + 3;
      local_300 = 0x7ffffffffffffffe - (long)iVar31;
      lStack_2f8 = local_300;
      lStack_2f0 = local_300;
      lStack_2e8 = local_300;
      auVar5._8_8_ = lVar28;
      auVar5._0_8_ = lVar28;
      auVar5._16_8_ = lVar28;
      auVar5._24_8_ = lVar28;
      local_1e0 = vpblendd_avx2(ZEXT1632((undefined1  [16])0x0),auVar5,0x3f);
      local_2c0 = uVar25;
      uStack_2b8 = uVar25;
      uStack_2b0 = uVar25;
      uStack_2a8 = uVar25;
      local_2e0._4_4_ = 0;
      local_2e0._0_4_ = gap;
      local_2e0._8_4_ = gap;
      local_2e0._12_4_ = 0;
      local_2e0._16_4_ = gap;
      local_2e0._20_4_ = 0;
      local_2e0._24_4_ = gap;
      local_2e0._28_4_ = 0;
      lVar20 = (long)_s1Len;
      local_200 = lVar20;
      lStack_1f8 = lVar20;
      lStack_1f0 = lVar20;
      lStack_1e8 = lVar20;
      local_1c0 = uVar36;
      uStack_1b8 = uVar36;
      uStack_1b0 = uVar36;
      uStack_1a8 = uVar36;
      for (uVar25 = 0; lVar21 = lVar20, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar25;
          uVar25 = uVar25 + 1) {
        ptr[uVar25] = (long)matrix->mapper[(byte)_s1[uVar25]];
      }
      for (; lVar21 < (int)(_s1Len + 3); lVar21 = lVar21 + 1) {
        ptr[lVar21] = 0;
      }
      piVar1 = matrix->mapper;
      for (uVar25 = 0; uVar36 != uVar25; uVar25 = uVar25 + 1) {
        ptr_00[uVar25 + 3] = (long)piVar1[(byte)_s2[uVar25]];
      }
      for (lVar21 = 0; uVar25 = uVar36, lVar21 != 3; lVar21 = lVar21 + 1) {
        ptr_00[lVar21] = 0;
      }
      for (; (int)uVar25 < (int)uVar13; uVar25 = uVar25 + 1) {
        ptr_00[uVar25 + 3] = 0;
      }
      for (lVar21 = 0; uVar36 * 8 - lVar21 != 0; lVar21 = lVar21 + 8) {
        *(undefined8 *)((long)ptr_01 + lVar21 + 0x18) = 0;
        *(undefined8 *)((long)ptr_02 + lVar21 + 0x18) = 0;
        *(undefined8 *)((long)ptr_03 + lVar21 + 0x18) = 0;
        *(undefined8 *)((long)ptr_04 + lVar21 + 0x18) = 0;
        *(long *)((long)ptr_05 + lVar21 + 0x18) = lVar28;
        *(undefined8 *)((long)ptr_06 + lVar21 + 0x18) = 0;
        *(undefined8 *)((long)ptr_07 + lVar21 + 0x18) = 0;
        *(undefined8 *)((long)ptr_08 + lVar21 + 0x18) = 0;
      }
      for (lVar21 = 0; lVar21 != 0x18; lVar21 = lVar21 + 8) {
        *(long *)((long)ptr_01 + lVar21) = lVar28;
        *(undefined8 *)((long)ptr_02 + lVar21) = 0;
        *(undefined8 *)((long)ptr_03 + lVar21) = 0;
        *(undefined8 *)((long)ptr_04 + lVar21) = 0;
        *(long *)((long)ptr_05 + lVar21) = lVar28;
        *(undefined8 *)((long)ptr_06 + lVar21) = 0;
        *(undefined8 *)((long)ptr_07 + lVar21) = 0;
        *(undefined8 *)((long)ptr_08 + lVar21) = 0;
      }
      for (lVar21 = 0; s2Len + (int)lVar21 < (int)uVar13; lVar21 = lVar21 + 1) {
        ptr_01[uVar36 + lVar21 + 3] = lVar28;
        ptr_02[uVar36 + lVar21 + 3] = 0;
        ptr_03[uVar36 + lVar21 + 3] = 0;
        ptr_04[uVar36 + lVar21 + 3] = 0;
        ptr_05[uVar36 + lVar21 + 3] = lVar28;
        ptr_06[uVar36 + lVar21 + 3] = 0;
        ptr_07[uVar36 + lVar21 + 3] = 0;
        ptr_08[uVar36 + lVar21 + 3] = 0;
      }
      ptr_01[2] = 0;
      uVar17 = _s1Len - 1;
      local_4e0._8_8_ = 2;
      local_4e0._0_8_ = 3;
      local_4e0._16_8_ = 1;
      local_4e0._24_8_ = 0;
      local_3a0._8_8_ = lVar28;
      local_3a0._0_8_ = lVar28;
      local_3a0._16_8_ = lVar28;
      local_3a0._24_8_ = lVar28;
      auVar76 = ZEXT3264(local_3a0);
      auVar77 = ZEXT3264(local_3a0);
      auVar79 = ZEXT3264(local_3a0);
      auVar80 = ZEXT3264(local_3a0);
      auVar81 = ZEXT3264(local_3a0);
      auVar82 = ZEXT3264(local_3a0);
      local_380._8_8_ = local_300;
      local_380._0_8_ = local_300;
      local_380._16_8_ = local_300;
      local_380._24_8_ = local_300;
      for (uVar25 = 0; (long)uVar25 < lVar20; uVar25 = uVar25 + 4) {
        i = (uint)uVar25;
        if (matrix->type == 0) {
          uVar29 = ptr[uVar25];
          iVar22 = ptr[uVar25 + 1];
          iVar16 = ptr[uVar25 + 2];
          iVar26 = ptr[uVar25 + 3];
        }
        else {
          uVar18 = i | 1;
          if (lVar20 <= (long)(uVar25 | 1)) {
            uVar18 = uVar17;
          }
          iVar22 = (int64_t)(int)uVar18;
          uVar18 = i | 2;
          if (lVar20 <= (long)(uVar25 | 2)) {
            uVar18 = uVar17;
          }
          iVar16 = (int64_t)(int)uVar18;
          uVar18 = i | 3;
          if (lVar20 <= (long)(uVar25 | 3)) {
            uVar18 = uVar17;
          }
          iVar26 = (int64_t)(int)uVar18;
          uVar29 = uVar25;
        }
        local_180 = vpermpd_avx2(*(undefined1 (*) [32])(ptr + uVar25),0x1b);
        palVar2 = (__m256i *)matrix->matrix;
        lVar21 = (long)matrix->size;
        __return_storage_ptr__ = (__m256i *)((long)*palVar2 + iVar26 * lVar21 * 4);
        local_4a0 = ZEXT832(0) << 0x20;
        auVar7._8_8_ = lStack_1f8;
        auVar7._0_8_ = local_200;
        auVar7._16_8_ = lStack_1f0;
        auVar7._24_8_ = lStack_1e8;
        local_1a0 = vpcmpgtq_avx2(auVar7,local_4e0);
        local_2a0 = local_1e0._0_8_;
        uStack_298 = local_1e0._8_8_;
        uStack_290 = local_1e0._16_8_;
        uStack_288 = local_1e0._24_8_;
        local_4c0 = ZEXT1632(ZEXT816(0));
        local_560 = 0;
        uStack_558 = 0;
        uStack_550 = 0;
        uStack_548 = 0;
        local_680 = local_1e0;
        auVar78 = ZEXT864(0) << 0x40;
        auVar85 = ZEXT864(0) << 0x40;
        auVar84 = ZEXT864(0) << 0x40;
        auVar41._8_8_ = lVar28;
        auVar41._0_8_ = lVar28;
        auVar41._16_8_ = lVar28;
        auVar41._24_8_ = lVar28;
        local_500 = ZEXT1632(ZEXT816(0));
        local_520 = ZEXT1632(ZEXT816(0));
        local_540 = ZEXT1632(ZEXT816(0));
        auVar72 = ZEXT1664((undefined1  [16])0x0);
        auVar74 = ZEXT1664((undefined1  [16])0x0);
        auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
        local_340._8_8_ = 0xfffffffffffffffe;
        local_340._0_8_ = 0xfffffffffffffffd;
        local_340._16_8_ = 0xffffffffffffffff;
        local_340._24_8_ = 0;
        local_360 = auVar41;
        palVar32 = palVar2;
        local_5a0 = auVar41;
        for (uVar35 = 0; auVar40 = auVar79._0_32_, (~((int)uVar13 >> 0x1f) & uVar13) != uVar35;
            uVar35 = uVar35 + 1) {
          local_120 = auVar82._0_32_;
          local_100 = auVar81._0_32_;
          local_e0 = auVar80._0_32_;
          local_a0 = auVar77._0_32_;
          local_80 = auVar76._0_32_;
          auVar54 = vpermq_avx2(local_680,0xf9);
          iVar26 = ptr_01[uVar35 + 3];
          auVar55._8_8_ = iVar26;
          auVar55._0_8_ = iVar26;
          auVar55._16_8_ = iVar26;
          auVar55._24_8_ = iVar26;
          local_140 = vpblendd_avx2(auVar54,auVar55,0xc0);
          auVar54 = vpermpd_avx2(auVar78._0_32_,0xf9);
          iVar26 = ptr_02[uVar35 + 3];
          auVar56._8_8_ = iVar26;
          auVar56._0_8_ = iVar26;
          auVar56._16_8_ = iVar26;
          auVar56._24_8_ = iVar26;
          local_240 = vblendpd_avx(auVar54,auVar56,8);
          auVar54 = vpermpd_avx2(auVar85._0_32_,0xf9);
          iVar26 = ptr_03[uVar35 + 3];
          auVar57._8_8_ = iVar26;
          auVar57._0_8_ = iVar26;
          auVar57._16_8_ = iVar26;
          auVar57._24_8_ = iVar26;
          local_260 = vblendpd_avx(auVar54,auVar57,8);
          auVar54 = vpermpd_avx2(auVar84._0_32_,0xf9);
          iVar26 = ptr_04[uVar35 + 3];
          auVar58._8_8_ = iVar26;
          auVar58._0_8_ = iVar26;
          auVar58._16_8_ = iVar26;
          auVar58._24_8_ = iVar26;
          local_280 = vblendpd_avx(auVar54,auVar58,8);
          auVar54 = vpermq_avx2(auVar41,0xf9);
          iVar26 = ptr_05[uVar35 + 3];
          auVar59._8_8_ = iVar26;
          auVar59._0_8_ = iVar26;
          auVar59._16_8_ = iVar26;
          auVar59._24_8_ = iVar26;
          auVar41 = vpblendd_avx2(auVar54,auVar59,0xc0);
          auVar54 = vpermq_avx2(auVar72._0_32_,0xf9);
          iVar26 = ptr_06[uVar35 + 3];
          auVar67._8_8_ = iVar26;
          auVar67._0_8_ = iVar26;
          auVar67._16_8_ = iVar26;
          auVar67._24_8_ = iVar26;
          auVar7 = vpblendd_avx2(auVar54,auVar67,0xc0);
          auVar54 = vpermq_avx2(auVar74._0_32_,0xf9);
          iVar26 = ptr_07[uVar35 + 3];
          auVar68._8_8_ = iVar26;
          auVar68._0_8_ = iVar26;
          auVar68._16_8_ = iVar26;
          auVar68._24_8_ = iVar26;
          auVar8 = vpblendd_avx2(auVar54,auVar68,0xc0);
          auVar54 = vpermpd_avx2(auVar83._0_32_,0xf9);
          iVar26 = ptr_08[uVar35 + 3];
          auVar69._8_8_ = iVar26;
          auVar69._0_8_ = iVar26;
          auVar69._16_8_ = iVar26;
          auVar69._24_8_ = iVar26;
          auVar54 = vblendps_avx(auVar54,auVar69,0xc0);
          auVar3._8_8_ = uStack_2b8;
          auVar3._0_8_ = local_2c0;
          auVar3._16_8_ = uStack_2b0;
          auVar3._24_8_ = uStack_2a8;
          auVar5 = vpsubq_avx2(local_140,auVar3);
          local_160 = vpsubq_avx2(auVar41,local_2e0);
          a[2] = (longlong)ptr_07;
          a[0] = in_stack_fffffffffffff8e0._0_8_;
          a[1] = in_stack_fffffffffffff8e0._8_8_;
          a[3] = uVar36;
          b[1] = (longlong)ptr_08;
          b[0] = (longlong)ptr_00;
          b[2] = (longlong)ptr_06;
          b[3] = (longlong)ptr_05;
          auVar41 = auVar5;
          local_c0 = auVar40;
          _mm256_max_epi64_rpl(palVar32,a,b);
          auVar3 = vpcmpgtq_avx2(auVar5,local_160);
          auVar5 = vblendvpd_avx(auVar7,local_240,auVar3);
          auVar7 = vblendvpd_avx(auVar8,local_260,auVar3);
          auVar54 = vblendvpd_avx(auVar54,local_280,auVar3);
          auVar3 = vpcmpeqd_avx2(auVar41,auVar41);
          auVar56 = vpsubq_avx2(auVar54,auVar3);
          auVar8._8_8_ = uStack_2b8;
          auVar8._0_8_ = local_2c0;
          auVar8._16_8_ = uStack_2b0;
          auVar8._24_8_ = uStack_2a8;
          auVar54 = vpsubq_avx2(local_680,auVar8);
          auVar3 = vpsubq_avx2(local_5a0,local_2e0);
          a_00[2] = (longlong)ptr_07;
          a_00[0] = in_stack_fffffffffffff8e0._0_8_;
          a_00[1] = in_stack_fffffffffffff8e0._8_8_;
          a_00[3] = uVar36;
          b_00[1] = (longlong)ptr_08;
          b_00[0] = (longlong)ptr_00;
          b_00[2] = (longlong)ptr_06;
          b_00[3] = (longlong)ptr_05;
          auVar58 = auVar54;
          _mm256_max_epi64_rpl(palVar32,a_00,b_00);
          auVar8 = vpcmpgtq_avx2(auVar54,auVar3);
          auVar54 = vblendvpd_avx(local_500,auVar78._0_32_,auVar8);
          auVar3 = vblendvpd_avx(local_520,auVar85._0_32_,auVar8);
          auVar8 = vblendvpd_avx(local_540,auVar84._0_32_,auVar8);
          auVar57 = vpsubq_avx2(auVar8,_DAT_008a5a80);
          auVar8 = vpermq_avx2(local_360,0xf9);
          lVar27 = ptr_00[uVar35 + 3];
          auVar60._8_8_ = lVar27;
          auVar60._0_8_ = lVar27;
          auVar60._16_8_ = lVar27;
          auVar60._24_8_ = lVar27;
          local_360 = vpblendd_avx2(auVar8,auVar60,0xc0);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = (long)*(int *)((long)*palVar2 + lVar27 * 4 + uVar29 * lVar21 * 4);
          auVar52._8_8_ = 0;
          auVar52._0_8_ =
               (long)*(int *)((long)*palVar2 + ptr_00[uVar35 + 2] * 4 + iVar22 * lVar21 * 4);
          auVar51 = vpunpcklqdq_avx(auVar52,auVar39);
          auVar53._8_8_ = 0;
          auVar53._0_8_ =
               (long)*(int *)((long)*palVar2 + ptr_00[uVar35 + 1] * 4 + iVar16 * lVar21 * 4);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = (long)*(int *)((long)*__return_storage_ptr__ + ptr_00[uVar35] * 4);
          auVar63 = vpunpcklqdq_avx(auVar66,auVar53);
          auVar42._0_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar63;
          auVar42._16_16_ = ZEXT116(1) * auVar51;
          auVar6._8_8_ = uStack_298;
          auVar6._0_8_ = local_2a0;
          auVar6._16_8_ = uStack_290;
          auVar6._24_8_ = uStack_288;
          auVar8 = vpaddq_avx2(auVar42,auVar6);
          a_01[2] = (longlong)ptr_07;
          a_01[0] = in_stack_fffffffffffff8e0._0_8_;
          a_01[1] = in_stack_fffffffffffff8e0._8_8_;
          a_01[3] = uVar36;
          b_01[1] = (longlong)ptr_08;
          b_01[0] = (longlong)ptr_00;
          b_01[2] = (longlong)ptr_06;
          b_01[3] = (longlong)ptr_05;
          palVar32 = __return_storage_ptr__;
          auVar59 = auVar8;
          _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
          a_02[2] = (longlong)ptr_07;
          a_02[0] = in_stack_fffffffffffff8e0._0_8_;
          a_02[1] = in_stack_fffffffffffff8e0._8_8_;
          a_02[3] = uVar36;
          b_02[1] = (longlong)ptr_08;
          b_02[0] = (longlong)ptr_00;
          b_02[2] = (longlong)ptr_06;
          b_02[3] = (longlong)ptr_05;
          _mm256_max_epi64_rpl(palVar32,a_02,b_02);
          a_03[2] = (longlong)ptr_07;
          a_03[0] = in_stack_fffffffffffff8e0._0_8_;
          a_03[1] = in_stack_fffffffffffff8e0._8_8_;
          a_03[3] = uVar36;
          b_03[1] = (longlong)ptr_08;
          b_03[0] = (longlong)ptr_00;
          b_03[2] = (longlong)ptr_06;
          b_03[3] = (longlong)ptr_05;
          _mm256_max_epi64_rpl(palVar32,a_03,b_03);
          local_660 = auVar8._0_8_;
          lVar27 = auVar59._0_8_;
          auVar43._0_8_ = -(ulong)(lVar27 == local_660);
          lStack_658 = auVar8._8_8_;
          lVar34 = auVar59._8_8_;
          auVar43._8_8_ = -(ulong)(lVar34 == lStack_658);
          lVar30 = auVar59._16_8_;
          auVar43._16_8_ = -(ulong)(lVar30 == auVar8._16_8_);
          lStack_648 = auVar8._24_8_;
          lVar48 = auVar59._24_8_;
          auVar43._24_8_ = -(ulong)(lVar48 == lStack_648);
          local_620 = auVar41._0_8_;
          auVar61._0_8_ = -(ulong)(lVar27 == local_620);
          lStack_618 = auVar41._8_8_;
          auVar61._8_8_ = -(ulong)(lVar34 == lStack_618);
          auVar61._16_8_ = -(ulong)(lVar30 == auVar41._16_8_);
          lStack_608 = auVar41._24_8_;
          auVar61._24_8_ = -(ulong)(lVar48 == lStack_608);
          auVar70._0_8_ = -(ulong)(local_360._0_8_ == local_180._0_8_);
          auVar70._8_8_ = -(ulong)(local_360._8_8_ == local_180._8_8_);
          auVar70._16_8_ = -(ulong)(local_360._16_8_ == local_180._16_8_);
          auVar70._24_8_ = -(ulong)(local_360._24_8_ == local_180._24_8_);
          auVar6 = vpsubq_avx2(local_4a0,auVar70);
          auVar8 = vblendvpd_avx(auVar54,auVar5,auVar61);
          auVar8 = vblendvpd_avx(auVar8,auVar6,auVar43);
          auVar6 = vpcmpgtq_avx2(auVar42,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar42 = vpsubq_avx2(local_4c0,auVar6);
          auVar6 = vblendvpd_avx(auVar3,auVar7,auVar61);
          auVar6 = vblendvpd_avx(auVar6,auVar42,auVar43);
          auVar42 = vblendvpd_avx(auVar57,auVar56,auVar61);
          auVar4._8_8_ = uStack_558;
          auVar4._0_8_ = local_560;
          auVar4._16_8_ = uStack_550;
          auVar4._24_8_ = uStack_548;
          auVar55 = vpcmpeqd_avx2(auVar40,auVar40);
          auVar40 = vpsubq_avx2(auVar4,auVar55);
          auVar40 = vblendvpd_avx(auVar42,auVar40,auVar43);
          auVar62._0_8_ = -(ulong)(lVar27 == 0);
          auVar62._8_8_ = -(ulong)(lVar34 == SUB648(ZEXT1664((undefined1  [16])0x0),8));
          auVar62._16_8_ = -(ulong)(lVar30 == 0);
          auVar62._24_8_ = -(ulong)(lVar48 == 0);
          auVar75._0_8_ = -(ulong)(auVar55._0_8_ == local_340._0_8_);
          auVar75._8_8_ = -(ulong)(auVar55._8_8_ == local_340._8_8_);
          auVar75._16_8_ = -(ulong)(auVar55._16_8_ == local_340._16_8_);
          auVar75._24_8_ = -(ulong)(auVar55._24_8_ == local_340._24_8_);
          auVar42 = vpor_avx2(auVar75,auVar62);
          auVar8 = vpandn_avx2(auVar42,auVar8);
          auVar6 = vpandn_avx2(auVar42,auVar6);
          auVar40 = vpandn_avx2(auVar42,auVar40);
          local_680 = vpandn_avx2(auVar75,auVar59);
          auVar42 = auVar59;
          if (3 < uVar35) {
            auVar55 = vpcmpgtq_avx2(local_680,local_380);
            local_380 = vblendvpd_avx(local_680,local_380,auVar55);
            a_04[2] = (longlong)ptr_07;
            a_04[0] = in_stack_fffffffffffff8e0._0_8_;
            a_04[1] = in_stack_fffffffffffff8e0._8_8_;
            a_04[3] = uVar36;
            b_04[1] = (longlong)ptr_08;
            b_04[0] = (longlong)ptr_00;
            b_04[2] = (longlong)ptr_06;
            b_04[3] = (longlong)ptr_05;
            uVar37 = local_3a0._0_8_;
            uVar45 = local_3a0._8_8_;
            uVar46 = local_3a0._16_8_;
            uVar49 = local_3a0._24_8_;
            _mm256_max_epi64_rpl(palVar32,a_04,b_04);
            a_05[2] = (longlong)ptr_07;
            a_05[0] = in_stack_fffffffffffff8e0._0_8_;
            a_05[1] = in_stack_fffffffffffff8e0._8_8_;
            a_05[3] = uVar36;
            b_05[1] = (longlong)ptr_08;
            b_05[0] = (longlong)ptr_00;
            b_05[2] = (longlong)ptr_06;
            b_05[3] = (longlong)ptr_05;
            _mm256_max_epi64_rpl(palVar32,a_05,b_05);
            a_06[2] = (longlong)ptr_07;
            a_06[0] = in_stack_fffffffffffff8e0._0_8_;
            a_06[1] = in_stack_fffffffffffff8e0._8_8_;
            a_06[3] = uVar36;
            b_06[1] = (longlong)ptr_08;
            b_06[0] = (longlong)ptr_00;
            b_06[2] = (longlong)ptr_06;
            b_06[3] = (longlong)ptr_05;
            _mm256_max_epi64_rpl(palVar32,a_06,b_06);
            a_07[2] = (longlong)ptr_07;
            a_07[0] = in_stack_fffffffffffff8e0._0_8_;
            a_07[1] = in_stack_fffffffffffff8e0._8_8_;
            a_07[3] = uVar36;
            b_07[1] = (longlong)ptr_08;
            b_07[0] = (longlong)ptr_00;
            b_07[2] = (longlong)ptr_06;
            b_07[3] = (longlong)ptr_05;
            _mm256_max_epi64_rpl(palVar32,a_07,b_07);
            local_3a0._8_8_ = uVar45;
            local_3a0._0_8_ = uVar37;
            local_3a0._16_8_ = uVar46;
            local_3a0._24_8_ = uVar49;
          }
          iVar26 = vmovlpd_avx(local_680._0_16_);
          auVar9._8_8_ = lVar28;
          auVar9._0_8_ = lVar28;
          auVar9._16_8_ = lVar28;
          auVar9._24_8_ = lVar28;
          local_5a0 = vblendvpd_avx(auVar58,auVar9,auVar75);
          local_500 = vandnpd_avx(auVar75,auVar54);
          local_520 = vandnpd_avx(auVar75,auVar3);
          local_540 = vandnpd_avx(auVar75,auVar57);
          j = (int32_t)uVar35;
          vWH[2] = (longlong)ptr_07;
          vWH[0] = in_stack_fffffffffffff8e0._0_8_;
          vWH[1] = in_stack_fffffffffffff8e0._8_8_;
          vWH[3] = uVar36;
          arr_store_si256(*((ppVar15->field_4).trace)->trace_del_table,vWH,i,_s1Len,j,
                          (int32_t)uVar36);
          vWH_00[2] = (longlong)ptr_07;
          vWH_00[0] = in_stack_fffffffffffff8e0._0_8_;
          vWH_00[1] = in_stack_fffffffffffff8e0._8_8_;
          vWH_00[3] = uVar36;
          arr_store_si256(*(int **)((long)((ppVar15->field_4).trace)->trace_del_table + 8),vWH_00,i,
                          _s1Len,j,s2Len);
          vWH_01[2] = (longlong)ptr_07;
          vWH_01[0] = in_stack_fffffffffffff8e0._0_8_;
          vWH_01[1] = in_stack_fffffffffffff8e0._8_8_;
          vWH_01[3] = uVar36;
          arr_store_si256(*(int **)((long)((ppVar15->field_4).trace)->trace_del_table + 0x10),vWH_01
                          ,i,_s1Len,j,s2Len);
          palVar32 = *(__m256i **)((long)((ppVar15->field_4).trace)->trace_del_table + 0x18);
          vWH_02[2] = (longlong)ptr_07;
          vWH_02[0] = in_stack_fffffffffffff8e0._0_8_;
          vWH_02[1] = in_stack_fffffffffffff8e0._8_8_;
          vWH_02[3] = uVar36;
          arr_store_si256((int *)palVar32,vWH_02,i,_s1Len,j,s2Len);
          auVar55 = vpcmpeqd_avx2(auVar42,auVar42);
          auVar3 = vpcmpgtq_avx2(local_340,auVar55);
          auVar12._8_8_ = uStack_1b8;
          auVar12._0_8_ = local_1c0;
          auVar12._16_8_ = uStack_1b0;
          auVar12._24_8_ = uStack_1a8;
          auVar54 = vpcmpgtq_avx2(auVar12,local_340);
          auVar54 = vpand_avx2(auVar54,local_1a0);
          auVar3 = vpand_avx2(auVar54,auVar3);
          auVar51 = vpackssdw_avx(auVar3._0_16_,auVar3._16_16_);
          auVar71._0_8_ = -(ulong)(local_680._0_8_ == local_120._0_8_);
          auVar71._8_8_ = -(ulong)(local_680._8_8_ == local_120._8_8_);
          auVar71._16_8_ = -(ulong)(local_680._16_8_ == local_120._16_8_);
          auVar71._24_8_ = -(ulong)(local_680._24_8_ == local_120._24_8_);
          auVar57 = vpcmpgtq_avx2(local_680,local_120);
          auVar42 = vpand_avx2(auVar57,auVar3);
          auVar54 = vblendvpd_avx(local_120,auVar59,auVar42);
          auVar82 = ZEXT3264(auVar54);
          auVar63 = vpackssdw_avx(auVar42._0_16_,auVar42._16_16_);
          auVar54 = vpcmpgtq_avx2(local_100,local_340);
          auVar42 = vpand_avx2(auVar71,auVar54);
          auVar38 = vpackssdw_avx(auVar42._0_16_,auVar42._16_16_);
          auVar51 = vblendvps_avx(auVar63,auVar51,auVar38);
          auVar4 = vpmovsxdq_avx2(auVar51);
          auVar54 = vblendvpd_avx(local_e0,auVar8,auVar4);
          auVar80 = ZEXT3264(auVar54);
          auVar85 = ZEXT3264(auVar6);
          auVar54 = vblendvpd_avx(local_c0,auVar6,auVar4);
          auVar79 = ZEXT3264(auVar54);
          auVar54 = vblendvpd_avx(local_a0,auVar40,auVar4);
          auVar77 = ZEXT3264(auVar54);
          auVar54 = vblendvpd_avx(local_80,local_4e0,auVar4);
          auVar76 = ZEXT3264(auVar54);
          auVar54 = vpor_avx2(auVar42,auVar57);
          auVar54 = vpand_avx2(auVar3,auVar54);
          auVar54 = vblendvpd_avx(local_100,local_340,auVar54);
          auVar81 = ZEXT3264(auVar54);
          ptr_01[uVar35] = iVar26;
          iVar26 = vmovlpd_avx(auVar8._0_16_);
          ptr_02[uVar35] = iVar26;
          iVar26 = vmovlpd_avx(auVar6._0_16_);
          ptr_03[uVar35] = iVar26;
          iVar26 = vmovlpd_avx(auVar40._0_16_);
          ptr_04[uVar35] = iVar26;
          auVar84 = ZEXT3264(auVar40);
          ptr_05[uVar35] = local_620;
          auVar72 = ZEXT3264(auVar5);
          ptr_06[uVar35] = auVar5._0_8_;
          auVar74 = ZEXT3264(auVar7);
          ptr_07[uVar35] = auVar7._0_8_;
          auVar83 = ZEXT3264(auVar56);
          iVar26 = vmovlps_avx(auVar56._0_16_);
          ptr_08[uVar35] = iVar26;
          local_340 = vpsubq_avx2(local_340,auVar55);
          local_2a0 = local_140._0_8_;
          uStack_298 = local_140._8_8_;
          uStack_290 = local_140._16_8_;
          uStack_288 = local_140._24_8_;
          local_4a0 = local_240;
          local_4c0 = local_260;
          local_560 = local_280._0_8_;
          uStack_558 = local_280._8_8_;
          uStack_550 = local_280._16_8_;
          uStack_548 = local_280._24_8_;
          auVar78 = ZEXT3264(auVar8);
        }
        auVar44._8_8_ = 4;
        auVar44._0_8_ = 4;
        auVar44._16_8_ = 4;
        auVar44._24_8_ = 4;
        local_4e0 = vpaddq_avx2(local_4e0,auVar44);
      }
      local_220 = auVar82._0_32_;
      local_320 = auVar81._0_32_;
      local_3c0 = auVar80._0_32_;
      local_3e0 = auVar79._0_32_;
      local_400 = auVar77._0_32_;
      local_420 = auVar76._0_32_;
      lVar30 = 0;
      iVar33 = 0;
      iVar31 = 0;
      lVar20 = lVar28;
      lVar21 = lVar28;
      lVar27 = lVar28;
      lVar34 = lVar28;
      while( true ) {
        iVar24 = (int)lVar27;
        iVar19 = (int)lVar21;
        iVar14 = (int)lVar20;
        if ((int)lVar30 == 4) break;
        lVar48 = *(long *)(local_220 + lVar30 * 8);
        if (lVar34 < lVar48) {
          lVar20 = *(long *)(local_3c0 + lVar30 * 8);
          lVar21 = *(long *)(local_3e0 + lVar30 * 8);
          lVar27 = *(long *)(local_400 + lVar30 * 8);
          iVar31 = *(int *)(local_420 + lVar30 * 8);
          lVar34 = lVar48;
          iVar33 = *(int *)(local_320 + lVar30 * 8);
        }
        else if (lVar48 == lVar34) {
          lVar48 = *(long *)(local_320 + lVar30 * 8);
          if (lVar48 < iVar33) {
            lVar20 = *(long *)(local_3c0 + lVar30 * 8);
            lVar21 = *(long *)(local_3e0 + lVar30 * 8);
            lVar27 = *(long *)(local_400 + lVar30 * 8);
            iVar31 = *(int *)(local_420 + lVar30 * 8);
            iVar33 = (int)lVar48;
          }
          else if ((lVar48 == iVar33) && (*(long *)(local_420 + lVar30 * 8) < (long)iVar31)) {
            lVar20 = *(long *)(local_3c0 + lVar30 * 8);
            lVar21 = *(long *)(local_3e0 + lVar30 * 8);
            lVar27 = *(long *)(local_400 + lVar30 * 8);
            iVar31 = (int)*(long *)(local_420 + lVar30 * 8);
            iVar33 = (int)lVar48;
          }
        }
        lVar30 = lVar30 + 1;
      }
      auVar10._8_8_ = lVar28;
      auVar10._0_8_ = lVar28;
      auVar10._16_8_ = lVar28;
      auVar10._24_8_ = lVar28;
      auVar40 = vpcmpgtq_avx2(auVar10,local_380);
      auVar11._8_8_ = lStack_2f8;
      auVar11._0_8_ = local_300;
      auVar11._16_8_ = lStack_2f0;
      auVar11._24_8_ = lStack_2e8;
      auVar54 = vpcmpgtq_avx2(local_3a0,auVar11);
      auVar40 = vpor_avx2(auVar54,auVar40);
      if ((((auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           SUB321(auVar40 >> 0x7f,0) != '\0') || SUB321(auVar40 >> 0xbf,0) != '\0') ||
          auVar40[0x1f] < '\0') {
        *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
        lVar34 = 0;
        iVar14 = 0;
        iVar19 = 0;
        iVar24 = 0;
        iVar33 = 0;
        iVar31 = 0;
      }
      ppVar15->score = (int)lVar34;
      ppVar15->end_query = iVar31;
      ppVar15->end_ref = iVar33;
      ((ppVar15->field_4).stats)->matches = iVar14;
      ((ppVar15->field_4).stats)->similar = iVar19;
      ((ppVar15->field_4).stats)->length = iVar24;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar15;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(32, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i case1 = vZero;
        __m256i case2 = vZero;
        __m256i case0 = vZero;
        __m256i vNH = vNegInf0;
        __m256i vNM = vZero;
        __m256i vNS = vZero;
        __m256i vNL = vZero;
        __m256i vWH = vNegInf0;
        __m256i vWM = vZero;
        __m256i vWS = vZero;
        __m256i vWL = vZero;
        __m256i vE = vNegInf;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vEM = vZero;
        __m256i vES = vZero;
        __m256i vEL = vZero;
        __m256i vF = vNegInf;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vFM = vZero;
        __m256i vFS = vZero;
        __m256i vFL = vZero;
        __m256i vJ = vJreset;
        __m256i vs1 = _mm256_set_epi64x_rpl(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m256i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            __m256i vNWM = vNM;
            __m256i vNWS = vNS;
            __m256i vNWL = vNL;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vNM = _mm256_srli_si256_rpl(vWM, 8);
            vNM = _mm256_insert_epi64_rpl(vNM, HM_pr[j], 3);
            vNS = _mm256_srli_si256_rpl(vWS, 8);
            vNS = _mm256_insert_epi64_rpl(vNS, HS_pr[j], 3);
            vNL = _mm256_srli_si256_rpl(vWL, 8);
            vNL = _mm256_insert_epi64_rpl(vNL, HL_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vFM = _mm256_srli_si256_rpl(vFM, 8);
            vFM = _mm256_insert_epi64_rpl(vFM, FM_pr[j], 3);
            vFS = _mm256_srli_si256_rpl(vFS, 8);
            vFS = _mm256_insert_epi64_rpl(vFS, FS_pr[j], 3);
            vFL = _mm256_srli_si256_rpl(vFL, 8);
            vFL = _mm256_insert_epi64_rpl(vFL, FL_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vNM, case1);
            vFS = _mm256_blendv_epi8(vFS, vNS, case1);
            vFL = _mm256_blendv_epi8(vFL, vNL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vWM, case1);
            vES = _mm256_blendv_epi8(vES, vWS, case1);
            vEL = _mm256_blendv_epi8(vEL, vWL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vs2 = _mm256_srli_si256_rpl(vs2, 8);
            vs2 = _mm256_insert_epi64_rpl(vs2, s2[j], 3);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            vWH = _mm256_max_epi64_rpl(vWH, vZero);
            case1 = _mm256_cmpeq_epi64(vWH, vNWH);
            case2 = _mm256_cmpeq_epi64(vWH, vF);
            case0 = _mm256_cmpeq_epi64(vWH, vZero);
            vWM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vNWM,
                        _mm256_and_si256(
                            _mm256_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm256_blendv_epi8(vWM, vZero, case0);
            vWS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vNWS,
                        _mm256_and_si256(
                            _mm256_cmpgt_epi64(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm256_blendv_epi8(vWS, vZero, case0);
            vWL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vNWL, vOne), case1);
            vWL = _mm256_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vWM = _mm256_andnot_si256(cond, vWM);
                vWS = _mm256_andnot_si256(cond, vWS);
                vWL = _mm256_andnot_si256(cond, vWL);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm256_andnot_si256(cond, vEM);
                vES = _mm256_andnot_si256(cond, vES);
                vEL = _mm256_andnot_si256(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            HM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWM,0);
            HS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWS,0);
            HL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWL,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            FM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFM,0);
            FS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFS,0);
            FL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *m = (int64_t*)&vMaxM;
        int64_t *s = (int64_t*)&vMaxS;
        int64_t *l = (int64_t*)&vMaxL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}